

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::addRowsInterface
          (Highs *this,HighsInt ext_num_new_row,double *ext_row_lower,double *ext_row_upper,
          HighsInt ext_num_new_nz,HighsInt *ext_ar_start,HighsInt *ext_ar_index,double *ext_ar_value
          )

{
  HighsModel *lp;
  HighsInt *pHVar1;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar2;
  HighsInt bound_scale;
  int iVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  pointer piVar6;
  bool bVar7;
  HighsStatus HVar8;
  ulong uVar9;
  size_type __new_size;
  long lVar10;
  Highs *pHVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  HighsIndexCollection index_collection;
  allocator_type local_2ed;
  HighsStatus local_2ec;
  string local_2e8;
  Highs *local_2c8;
  HighsLogOptions *local_2c0;
  ulong local_2b8;
  HighsLp *local_2b0;
  undefined1 local_2a8 [16];
  vector<int,_std::allocator<int>_> local_298;
  pointer local_280;
  pointer local_268;
  pointer piStack_260;
  pointer piStack_258;
  pointer local_250;
  pointer pdStack_248;
  pointer pdStack_240;
  vector<double,_std::allocator<double>_> local_238;
  vector<double,_std::allocator<double>_> local_220;
  long local_208;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_200;
  HighsIndexCollection local_1f8;
  string local_1a8;
  string local_188;
  HighsLogOptions local_168;
  HighsLogOptions local_108;
  HighsSparseMatrix local_a0;
  long lVar15;
  
  if ((ext_num_new_nz | ext_num_new_row) < 0) {
    return kError;
  }
  if (ext_num_new_row == 0) {
    return kOk;
  }
  local_2c0 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_2c8 = this;
  bVar7 = isRowDataNull(local_2c0,ext_row_lower,ext_row_upper);
  if (bVar7) {
    return kError;
  }
  if ((ext_num_new_nz != 0) &&
     (bVar7 = isMatrixDataNull(local_2c0,ext_ar_start,ext_ar_index,ext_ar_value), bVar7)) {
    return kError;
  }
  if ((ext_num_new_nz != 0) && ((local_2c8->model_).lp_.num_col_ < 1)) {
    return kError;
  }
  local_208 = (long)(local_2c8->model_).lp_.num_row_;
  local_1f8.is_set_ = false;
  local_1f8.set_num_entries_ = -1;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_1f8._41_8_ = 0;
  local_1f8.is_interval_ = true;
  local_1f8._8_8_ = (ulong)(ext_num_new_row - 1) << 0x20;
  uVar9 = (ulong)(uint)ext_num_new_row;
  local_1f8.dimension_ = ext_num_new_row;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_220,ext_row_lower,ext_row_lower + uVar9
             ,(allocator_type *)local_2a8);
  local_2b8 = uVar9;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_238,ext_row_upper,ext_row_upper + uVar9
             ,(allocator_type *)local_2a8);
  pHVar11 = local_2c8;
  local_108.log_stream = local_2c0->log_stream;
  local_108.output_flag = local_2c0->output_flag;
  local_108.log_to_console = local_2c0->log_to_console;
  local_108.log_dev_level = local_2c0->log_dev_level;
  local_108.user_log_callback = local_2c0->user_log_callback;
  local_108.user_log_callback_data = local_2c0->user_log_callback_data;
  pfVar2 = &local_108.user_callback;
  local_200 = &(local_2c8->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar2,local_200);
  local_108.user_callback_active =
       (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_108.user_callback_data =
       (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar8 = assessBounds(&pHVar11->options_,"Row",(pHVar11->model_).lp_.num_row_,&local_1f8,&local_220
                       ,&local_238,(pHVar11->options_).super_HighsOptionsStruct.infinite_bound,
                       (HighsVarType *)0x0);
  local_2a8._0_8_ = &local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"assessBounds","");
  local_2ec = interpretCallStatus(&local_108,HVar8,kOk,(string *)local_2a8);
  if ((vector<int,_std::allocator<int>_> *)local_2a8._0_8_ != &local_298) {
    operator_delete((void *)local_2a8._0_8_);
  }
  pHVar11 = local_2c8;
  if (local_108.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  HVar8 = kError;
  if (local_2ec == kError) goto LAB_00231383;
  bound_scale = (pHVar11->model_).lp_.user_bound_scale_;
  if (bound_scale != 0) {
    bVar7 = boundScaleOk(&local_220,&local_238,bound_scale,
                         (pHVar11->options_).super_HighsOptionsStruct.infinite_bound);
    if (!bVar7) {
      highsLogUser(local_2c0,kError,"User bound scaling yields infinite bound\n");
      goto LAB_00231383;
    }
    dVar12 = ldexp(1.0,(pHVar11->model_).lp_.user_bound_scale_);
    if (0 < ext_num_new_row) {
      uVar9 = 0;
      do {
        local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] * dVar12;
        local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] * dVar12;
        uVar9 = uVar9 + 1;
      } while (local_2b8 != uVar9);
    }
  }
  lp = &pHVar11->model_;
  appendRowsToLpVectors(&lp->lp_,ext_num_new_row,&local_220,&local_238);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_2a8);
  local_2a8._4_4_ = (lp->lp_).num_col_;
  local_2a8._0_4_ = 2;
  local_2b0 = &lp->lp_;
  local_2a8._8_4_ = ext_num_new_row;
  if (ext_num_new_nz == 0) {
    local_2e8._M_dataplus._M_p = local_2e8._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_298,(ulong)(ext_num_new_row + 1),(value_type_conflict2 *)&local_2e8);
    HVar8 = local_2ec;
LAB_00231161:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,(HighsSparseMatrix *)local_2a8);
    HighsSparseMatrix::addRows(&(pHVar11->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((pHVar11->model_).lp_.scale_.has_scaling == true) {
      __new_size = local_208 + ext_num_new_row;
      std::vector<double,_std::allocator<double>_>::resize
                (&(pHVar11->model_).lp_.scale_.row,__new_size);
      auVar5 = _DAT_003c57d0;
      if (0 < ext_num_new_row) {
        iVar3 = (pHVar11->model_).lp_.num_row_;
        pdVar4 = (pHVar11->model_).lp_.scale_.row.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar10 = local_2b8 - 1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        lVar10 = 0;
        auVar13 = auVar13 ^ _DAT_003c57d0;
        auVar14 = _DAT_003c57c0;
        do {
          auVar16 = auVar14 ^ auVar5;
          if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                      auVar13._4_4_ < auVar16._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar4 + lVar10 + (long)iVar3 * 8) = 0x3ff0000000000000;
          }
          if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
              auVar16._12_4_ <= auVar13._12_4_) {
            *(undefined8 *)((long)pdVar4 + lVar10 + (long)iVar3 * 8 + 8) = 0x3ff0000000000000;
          }
          lVar15 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar15 + 2;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)(ext_num_new_row + 1U >> 1) << 4 != lVar10);
      }
      (pHVar11->model_).lp_.scale_.num_row = (HighsInt)__new_size;
      HighsSparseMatrix::applyColScale((HighsSparseMatrix *)local_2a8,&(pHVar11->model_).lp_.scale_)
      ;
      HighsSparseMatrix::considerRowScaling
                ((HighsSparseMatrix *)local_2a8,
                 (pHVar11->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (pHVar11->model_).lp_.scale_.row.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + (pHVar11->model_).lp_.num_row_);
    }
    if ((pHVar11->basis_).useful == true) {
      appendBasicRowsToBasisInterface(pHVar11,ext_num_new_row);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    HighsLp::addRowNames(local_2b0,&local_1a8,ext_num_new_row);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    pHVar1 = &(pHVar11->model_).lp_.num_row_;
    *pHVar1 = *pHVar1 + ext_num_new_row;
    invalidateModelStatusSolutionAndInfo(pHVar11);
    HEkk::addRows(&pHVar11->ekk_instance_,local_2b0,(HighsSparseMatrix *)local_2a8);
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2e8,ext_ar_start,ext_ar_start + local_2b8,
               &local_2ed);
    piVar6 = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_2e8._M_dataplus._M_p;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_2e8._M_string_length;
    local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_2e8.field_2._M_allocated_capacity;
    local_2e8._M_dataplus._M_p = (pointer)0x0;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)piVar6 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(piVar6);
    }
    if ((pointer)local_2e8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_298,(ulong)(ext_num_new_row + 1));
    *(HighsInt *)
     ((long)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + local_2b8 * 4) = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2e8,ext_ar_index,
               ext_ar_index + (uint)ext_num_new_nz,&local_2ed);
    piVar6 = local_268;
    local_268 = (pointer)local_2e8._M_dataplus._M_p;
    piStack_260 = (pointer)local_2e8._M_string_length;
    piStack_258 = (pointer)local_2e8.field_2._M_allocated_capacity;
    local_2e8._M_dataplus._M_p = (pointer)0x0;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_allocated_capacity = 0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6);
    }
    if ((pointer)local_2e8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_2e8,ext_ar_value,
               ext_ar_value + (uint)ext_num_new_nz,(allocator_type *)&local_2ed);
    pdVar4 = local_250;
    local_250 = (pointer)local_2e8._M_dataplus._M_p;
    pdStack_248 = (pointer)local_2e8._M_string_length;
    pdStack_240 = (pointer)local_2e8.field_2._M_allocated_capacity;
    local_2e8._M_dataplus._M_p = (pointer)0x0;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_allocated_capacity = 0;
    if (pdVar4 != (pointer)0x0) {
      operator_delete(pdVar4);
    }
    if (local_2e8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    local_168.log_stream = local_2c0->log_stream;
    local_168.output_flag = local_2c0->output_flag;
    local_168.log_to_console = local_2c0->log_to_console;
    local_168.log_dev_level = local_2c0->log_dev_level;
    local_168.user_log_callback = local_2c0->user_log_callback;
    local_168.user_log_callback_data = local_2c0->user_log_callback_data;
    pfVar2 = &local_168.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar2,local_200);
    local_168.user_callback_active =
         (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_168.user_callback_data =
         (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"LP","");
    HVar8 = HighsSparseMatrix::assess
                      ((HighsSparseMatrix *)local_2a8,local_2c0,&local_188,
                       (pHVar11->options_).super_HighsOptionsStruct.small_matrix_value,
                       (pHVar11->options_).super_HighsOptionsStruct.large_matrix_value);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"assessMatrix","");
    HVar8 = interpretCallStatus(&local_168,HVar8,local_2ec,&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    pHVar11 = local_2c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if (local_168.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_168.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (HVar8 != kError) goto LAB_00231161;
    HVar8 = kError;
  }
  if (local_250 != (pointer)0x0) {
    operator_delete(local_250);
  }
  if (local_268 != (pointer)0x0) {
    operator_delete(local_268);
  }
  if (local_280 != (pointer)0x0) {
    operator_delete(local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00231383:
  if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar8;
}

Assistant:

HighsStatus Highs::addRowsInterface(HighsInt ext_num_new_row,
                                    const double* ext_row_lower,
                                    const double* ext_row_upper,
                                    HighsInt ext_num_new_nz,
                                    const HighsInt* ext_ar_start,
                                    const HighsInt* ext_ar_index,
                                    const double* ext_ar_value) {
  // addRows is fundamentally different from addCols, since the new
  // matrix data are held row-wise, so we have to insert data into the
  // column-wise matrix of the LP.
  if (kExtendInvertWhenAddingRows) {
    if (ekk_instance_.status_.has_nla)
      ekk_instance_.debugNlaCheckInvert("Start of Highs::addRowsInterface",
                                        kHighsDebugLevelExpensive + 1);
  }
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_row < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_row == 0) return HighsStatus::kOk;
  if (ext_num_new_row > 0)
    if (isRowDataNull(options.log_options, ext_row_lower, ext_row_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_ar_start, ext_ar_index,
                         ext_ar_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;

  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of columns
  if (lp.num_col_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of rows
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_row;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_row - 1;
  // Take a copy of the bounds that can be normalised
  std::vector<double> local_rowLower{ext_row_lower,
                                     ext_row_lower + ext_num_new_row};
  std::vector<double> local_rowUpper{ext_row_upper,
                                     ext_row_upper + ext_num_new_row};

  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Row", lp.num_row_, index_collection,
                   local_rowLower, local_rowUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  // Append the rows to the LP vectors
  appendRowsToLpVectors(lp, ext_num_new_row, local_rowLower, local_rowUpper);

  // Form a row-wise HighsSparseMatrix of the new matrix rows so that
  // is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_ar_matrix;
  local_ar_matrix.num_col_ = lp.num_col_;
  local_ar_matrix.num_row_ = ext_num_new_row;
  local_ar_matrix.format_ = MatrixFormat::kRowwise;
  if (ext_num_new_nz) {
    local_ar_matrix.start_ = {ext_ar_start, ext_ar_start + ext_num_new_row};
    local_ar_matrix.start_.resize(ext_num_new_row + 1);
    local_ar_matrix.start_[ext_num_new_row] = ext_num_new_nz;
    local_ar_matrix.index_ = {ext_ar_index, ext_ar_index + ext_num_new_nz};
    local_ar_matrix.value_ = {ext_ar_value, ext_ar_value + ext_num_new_nz};
    // Assess the matrix columns
    return_status =
        interpretCallStatus(options_.log_options,
                            local_ar_matrix.assess(options.log_options, "LP",
                                                   options.small_matrix_value,
                                                   options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is row-wise or
    // column-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty row-wise HighsSparseMatrix of the new matrix
    // rows
    local_ar_matrix.start_.assign(ext_num_new_row + 1, 0);
  }
  // Append the rows to LP matrix
  lp.a_matrix_.addRows(local_ar_matrix);
  if (lp_has_scaling) {
    // Extend the row scaling factors
    scale.row.resize(newNumRow);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++)
      scale.row[lp.num_row_ + iRow] = 1.0;
    scale.num_row = newNumRow;
    // Apply the existing column scaling to the new rows
    local_ar_matrix.applyColScale(scale);
    // Consider applying row scaling to the new rows.
    local_ar_matrix.considerRowScaling(options.allowed_matrix_scale_factor,
                                       &scale.row[lp.num_row_]);
  }
  // Update the basis corresponding to new basic rows
  if (useful_basis) appendBasicRowsToBasisInterface(ext_num_new_row);

  // Possibly add row names
  lp.addRowNames("", ext_num_new_row);

  // Increase the number of rows in the LP
  lp.num_row_ += ext_num_new_row;
  assert(lpDimensionsOk("addRows", lp, options.log_options));

  // Deduce the consequences of adding new rows
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.addRows(lp, local_ar_matrix);

  return return_status;
}